

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.h
# Opt level: O3

EventMeta * rlib::midi::EventMeta::createTempo(EventMeta *__return_storage_ptr__,double tempo)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  long lVar3;
  initializer_list<unsigned_char> __l;
  undefined4 local_30;
  allocator_type local_2c;
  uchar local_2b;
  undefined2 local_2a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  puVar2 = (undefined1 *)((long)&local_30 + 3);
  local_30 = (int)(long)(60000000.0 / tempo);
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_30 + lVar3);
    *(undefined1 *)((long)&local_30 + lVar3) = *puVar2;
    *puVar2 = uVar1;
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + -1;
  } while (lVar3 != 2);
  local_2b = local_30._1_1_;
  local_2a = local_30._2_2_;
  __l._M_len = 3;
  __l._M_array = &local_2b;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_28,__l,&local_2c);
  (__return_storage_ptr__->super_Event)._vptr_Event = (_func_int **)&PTR__EventMeta_00168d60;
  __return_storage_ptr__->type = tempo;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

static EventMeta createTempo(double tempo) {
			union {
				uint8_t		buf[4] = { 0, };
				uint32_t	tempo;
			}t;
			assert(sizeof(t) == 4);
			t.tempo = static_cast<uint32_t>(60000000.0 / tempo);		// 4分音符の時間(microsec)
			std::reverse(reinterpret_cast<uint8_t*>(&t.tempo), reinterpret_cast<uint8_t*>(&t.tempo) + sizeof(t.tempo));		// エンディアン変更
			return EventMeta(Type::tempo, { t.buf[1], t.buf[2], t.buf[3] });
		}